

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O1

wchar_t archive_match_exclude_entry(archive *_a,wchar_t flag,archive_entry *entry)

{
  size_t *rbt;
  archive_rb_node *paVar1;
  int iVar2;
  wchar_t wVar3;
  archive_string_conv *self;
  char *pcVar4;
  iconv_t pvVar5;
  char *pcVar6;
  size_t sVar7;
  archive_rb_node *paVar8;
  
  iVar2 = __archive_check_magic(_a,0xcad11c9,1,"archive_match_time_include_entry");
  if (iVar2 == -0x1e) {
    return L'\xffffffe2';
  }
  if (entry == (archive_entry *)0x0) {
    pcVar4 = "entry is NULL";
  }
  else {
    wVar3 = validate_time_flag(_a,flag,"archive_match_exclude_entry");
    if (wVar3 != L'\0') {
      return wVar3;
    }
    self = (archive_string_conv *)calloc(1,0xb0);
    if (self == (archive_string_conv *)0x0) {
      archive_set_error(_a,0xc,"No memory");
      _a->state = 0x8000;
      return L'\xffffffe2';
    }
    pcVar4 = archive_entry_pathname(entry);
    if (pcVar4 != (char *)0x0) {
      archive_mstring_copy_mbs((archive_mstring *)&self->same,pcVar4);
      rbt = &_a[2].error_string.buffer_length;
      _a[2].current_code = (char *)&rb_ops_mbs;
      self[1].same = flag;
      pvVar5 = (iconv_t)archive_entry_mtime(entry);
      self[1].cd = pvVar5;
      pvVar5 = (iconv_t)archive_entry_mtime_nsec(entry);
      self[1].cd_w = pvVar5;
      pcVar6 = (char *)archive_entry_ctime(entry);
      self[1].utftmp.s = pcVar6;
      sVar7 = archive_entry_ctime_nsec(entry);
      self[1].utftmp.length = sVar7;
      iVar2 = __archive_rb_tree_insert_node((archive_rb_tree *)rbt,(archive_rb_node *)self);
      if (iVar2 == 0) {
        paVar8 = __archive_rb_tree_find_node((archive_rb_tree *)rbt,pcVar4);
        if (paVar8 != (archive_rb_node *)0x0) {
          *(wchar_t *)&paVar8[5].rb_info = self[1].same;
          paVar1 = (archive_rb_node *)self[1].cd_w;
          paVar8[6].rb_nodes[0] = (archive_rb_node *)self[1].cd;
          paVar8[6].rb_nodes[1] = paVar1;
          paVar1 = (archive_rb_node *)self[1].utftmp.length;
          paVar8[6].rb_info = (uintptr_t)self[1].utftmp.s;
          paVar8[7].rb_nodes[0] = paVar1;
        }
        archive_mstring_clean((archive_mstring *)&self->same);
        free(self);
      }
      else {
        (_a[2].sconv)->next = self;
        _a[2].sconv = (archive_string_conv *)&self->from_cp;
        _a[3].magic = _a[3].magic + 1;
        *(byte *)&_a[1].magic = (byte)_a[1].magic | 2;
      }
      return L'\0';
    }
    free(self);
    pcVar4 = "pathname is NULL";
  }
  archive_set_error(_a,0x16,pcVar4);
  return L'\xffffffe7';
}

Assistant:

int
archive_match_exclude_entry(struct archive *_a, int flag,
    struct archive_entry *entry)
{
	struct archive_match *a;
	int r;

	archive_check_magic(_a, ARCHIVE_MATCH_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_match_time_include_entry");
	a = (struct archive_match *)_a;

	if (entry == NULL) {
		archive_set_error(&(a->archive), EINVAL, "entry is NULL");
		return (ARCHIVE_FAILED);
	}
	r = validate_time_flag(_a, flag, "archive_match_exclude_entry");
	if (r != ARCHIVE_OK)
		return (r);
	return (add_entry(a, flag, entry));
}